

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

void czh::utils::digit_gen(DiyFp W,DiyFp Mp,DiyFp delta,string *buffer,int *K)

{
  bool bVar1;
  ulong uVar2;
  DiyFp DVar3;
  long local_98;
  uint64_t unit;
  uint64_t tmp;
  uint64_t p2;
  uint32_t p1;
  DiyFp wp_w;
  DiyFp one;
  int kappa;
  int d;
  uint32_t div;
  DiyFp delta_local;
  DiyFp Mp_local;
  DiyFp W_local;
  
  _d = delta.f;
  delta_local._8_8_ = Mp.f;
  Mp_local._8_8_ = W.f;
  Mp_local.f._0_4_ = Mp.e;
  delta_local.f._0_4_ = delta.e;
  DiyFp::DiyFp((DiyFp *)&wp_w.e,1L << (-(char)Mp.e & 0x3fU),(int)Mp_local.f);
  DVar3 = DiyFp::operator-((DiyFp *)&delta_local.e,(DiyFp *)&Mp_local.e);
  wp_w.f._0_4_ = DVar3.e;
  p2._4_4_ = (uint)((ulong)delta_local._8_8_ >> (-(char)one.f & 0x3fU));
  tmp = delta_local._8_8_ & wp_w._8_8_ - 1;
  one._12_4_ = 10;
  kappa = 1000000000;
  while( true ) {
    if ((int)one._12_4_ < 1) {
      local_98 = 1;
      do {
        _d = _d * 10;
        local_98 = local_98 * 10;
        uVar2 = tmp * 10 >> (-(char)one.f & 0x3fU);
        if (((int)uVar2 != 0) ||
           (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty(buffer), !bVar1)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(buffer,(char)uVar2 + '0');
        }
        tmp = wp_w._8_8_ - 1 & tmp * 10;
        one._12_4_ = one._12_4_ + -1;
      } while (_d <= tmp);
      *K = one._12_4_ + *K;
      grisu_round(buffer,_d,tmp,wp_w._8_8_,DVar3.f * local_98);
      return;
    }
    if ((p2._4_4_ / (uint)kappa != 0) ||
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(buffer), !bVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (buffer,(char)(p2._4_4_ / (uint)kappa) + '0');
    }
    p2._4_4_ = p2._4_4_ % (uint)kappa;
    one._12_4_ = one._12_4_ + -1;
    uVar2 = ((ulong)p2._4_4_ << (-(char)one.f & 0x3fU)) + tmp;
    if (uVar2 <= _d) break;
    kappa = (uint)kappa / 10;
  }
  *K = one._12_4_ + *K;
  grisu_round(buffer,_d,uVar2,(ulong)(uint)kappa << (-(char)one.f & 0x3fU),DVar3.f);
  return;
}

Assistant:

void digit_gen(DiyFp W, DiyFp Mp, DiyFp delta, std::string &buffer, int &K)
  {
    uint32_t div;
    int d, kappa;
    DiyFp one{((uint64_t) 1) << -Mp.e, Mp.e};
    DiyFp wp_w = Mp - W;
    uint32_t p1 = Mp.f >> -one.e;
    uint64_t p2 = Mp.f & (one.f - 1);
    kappa = 10;
    div = TEN9;
    while (kappa > 0)
    {
      d = static_cast<int>(p1 / div);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p1 %= div;
      kappa--;
      uint64_t tmp = (((uint64_t) p1) << -one.e) + p2;
      if (tmp <= delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, tmp, ((uint64_t) div) << -one.e, wp_w.f);
        return;
      }
      div /= 10;
    }
    uint64_t unit = 1;
    while (true)
    {
      p2 *= 10;
      delta.f *= 10;
      unit *= 10;
      d = static_cast<int>(p2 >> -one.e);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p2 &= one.f - 1;
      kappa--;
      if (p2 < delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, p2, one.f, wp_w.f * unit);
        return;
      }
    }
  }